

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

char * cutstring(char **p,int *len)

{
  int iVar1;
  char *end_00;
  char *dst;
  char *s;
  char *end;
  int *len_local;
  char **p_local;
  
  *p = *p + 1;
  end_00 = parsestring(*p);
  dst = newstring((long)end_00 - (long)*p);
  iVar1 = unescapestring(dst,*p,end_00);
  *len = iVar1;
  dst[*len] = '\0';
  *p = end_00;
  if (**p == '\"') {
    *p = *p + 1;
  }
  return dst;
}

Assistant:

static inline char *cutstring(const char *&p, int &len)
{
    p++;
    const char *end = parsestring(p);
    char *s = newstring(end - p);
    len = unescapestring(s, p, end);
    s[len] = '\0';
    p = end;
    if(*p=='\"') p++;
    return s;
}